

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

Statement * routineStatement(Statement *__return_storage_ptr__,Compiler *compiler)

{
  Token t;
  Token t_00;
  int iVar1;
  uint uVar2;
  TokenType TVar3;
  char *pcVar4;
  char **ppcVar5;
  undefined8 in_stack_fffffffffffffec8;
  Statement *s;
  Token local_100;
  Block local_e0;
  Token local_d0 [2];
  Token local_90;
  Token local_70;
  Token local_50;
  Token local_30;
  Compiler *local_10;
  Compiler *compiler_local;
  
  __return_storage_ptr__->type = STATEMENT_ROUTINE;
  local_10 = compiler;
  iVar1 = presentLine();
  (__return_storage_ptr__->field_1).blockStatement.numStatements = iVar1;
  *(undefined4 *)&(__return_storage_ptr__->field_1).breakStatement.pos.file = 0;
  (__return_storage_ptr__->field_1).routine.arguments = (char **)0x0;
  (__return_storage_ptr__->field_1).blockStatement.statements = (Statement *)0x0;
  (__return_storage_ptr__->field_1).routine.isNative = 0;
  if (0 < local_10->indentLevel) {
    uVar2 = presentLine();
    printf("\x1b[31m\n[Error] [Line:%d] Routines can only be declared in top level indent!\x1b[0m",
           (ulong)uVar2);
    he = he + 1;
  }
  iVar1 = match(TOKEN_FOREIGN);
  if (iVar1 != 0) {
    (__return_storage_ptr__->field_1).routine.isNative = 1;
  }
  consume(&local_30,TOKEN_IDENTIFIER,"Expected routine name!");
  t.start = local_30.file;
  t._0_8_ = local_30.start;
  t.file = (char *)local_30._24_8_;
  t.length = (int)in_stack_fffffffffffffec8;
  t.line = (int)((ulong)in_stack_fffffffffffffec8 >> 0x20);
  pcVar4 = stringOf(t);
  (__return_storage_ptr__->field_1).routine.name = pcVar4;
  consume(&local_50,TOKEN_LEFT_PAREN,"Expected \'(\' after routine declaration!");
  TVar3 = peek();
  if (TVar3 == TOKEN_RIGHT_PAREN) {
    advance();
  }
  else {
    do {
      *(int *)&(__return_storage_ptr__->field_1).breakStatement.pos.file =
           *(int *)&(__return_storage_ptr__->field_1).breakStatement.pos.file + 1;
      ppcVar5 = (char **)realloc((__return_storage_ptr__->field_1).routine.arguments,
                                 (long)(__return_storage_ptr__->field_1).ifStatement.thenBranch.
                                       numStatements << 3);
      (__return_storage_ptr__->field_1).routine.arguments = ppcVar5;
      consume(&local_70,TOKEN_IDENTIFIER,"Expected identifer as argument!");
      t_00.start = local_70.file;
      t_00._0_8_ = local_70.start;
      t_00.file = (char *)local_70._24_8_;
      t_00.length = (int)in_stack_fffffffffffffec8;
      t_00.line = (int)((ulong)in_stack_fffffffffffffec8 >> 0x20);
      pcVar4 = stringOf(t_00);
      (__return_storage_ptr__->field_1).routine.arguments
      [*(int *)&(__return_storage_ptr__->field_1).breakStatement.pos.file + -1] = pcVar4;
      iVar1 = match(TOKEN_COMMA);
    } while (iVar1 != 0);
    consume(&local_90,TOKEN_RIGHT_PAREN,"Expected \')\' after argument declaration!");
  }
  consume(local_d0,TOKEN_NEWLINE,"Expected newline after routine declaration!");
  if ((__return_storage_ptr__->field_1).routine.isNative == 0) {
    local_e0 = blockStatement(local_10,BLOCK_FUNC);
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x28) = local_e0._0_8_;
    *(Statement **)((long)&__return_storage_ptr__->field_1 + 0x30) = local_e0.statements;
    consume(&local_100,TOKEN_ENDROUTINE,"Expected EndRoutine after routine definition!");
    consume((Token *)&s,TOKEN_NEWLINE,"Expected newline after routine definition!");
  }
  return __return_storage_ptr__;
}

Assistant:

static Statement routineStatement(Compiler *compiler){
    Statement s;
    s.type = STATEMENT_ROUTINE;
    s.routine.line = presentLine();
    s.routine.arity = 0;
    s.routine.arguments = NULL;   
    s.routine.name = NULL;
    s.routine.isNative = 0;

    if(compiler->indentLevel > 0){
        printf(line_error("Routines can only be declared in top level indent!"), presentLine());
        he++;
    }

    if(match(TOKEN_FOREIGN))
        s.routine.isNative = 1;
    
    s.routine.name = stringOf(consume(TOKEN_IDENTIFIER, "Expected routine name!"));
    consume(TOKEN_LEFT_PAREN, "Expected '(' after routine declaration!");
    if(peek() != TOKEN_RIGHT_PAREN){
        do{
            s.routine.arity++;
            s.routine.arguments = (char **)reallocate(s.routine.arguments, sizeof(char *) * s.routine.arity);
            s.routine.arguments[s.routine.arity - 1] = stringOf(consume(TOKEN_IDENTIFIER, "Expected identifer as argument!"));
        } while(match(TOKEN_COMMA));
        consume(TOKEN_RIGHT_PAREN, "Expected ')' after argument declaration!");
    }
    else
        advance();
    consume(TOKEN_NEWLINE, "Expected newline after routine declaration!");

    if(s.routine.isNative == 0){
        s.routine.code = blockStatement(compiler, BLOCK_FUNC);

        consume(TOKEN_ENDROUTINE, "Expected EndRoutine after routine definition!");
        consume(TOKEN_NEWLINE, "Expected newline after routine definition!");
    }
    return s;
}